

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O0

void __thiscall QPathEdit::dialogFileSelected(QPathEdit *this,QString *file)

{
  QLineEdit *pQVar1;
  bool bVar2;
  QString *pQVar3;
  QArrayDataPointer<char16_t> local_d0;
  QString local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QString local_88;
  undefined1 local_60 [8];
  QStringList files;
  QString *file_local;
  QPathEdit *this_local;
  char16_t *str_1;
  char16_t *str;
  
  files.d.size = (qsizetype)file;
  bVar2 = QString::isEmpty(file);
  if (!bVar2) {
    QFileDialog::selectedFiles();
    pQVar1 = this->edit;
    pQVar3 = QList<QString>::first((QList<QString> *)local_60);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_a0,(Data *)0x0,L"\\",1);
    QString::QString(&local_88,&local_a0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_d0,(Data *)0x0,L"/",1);
    QString::QString(&local_b8,&local_d0);
    QString::replace(pQVar3,&local_88,(CaseSensitivity)&local_b8);
    QLineEdit::setText((QString *)pQVar1);
    QString::~QString(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QString::~QString(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    editTextUpdate(this);
    QList<QString>::~QList((QList<QString> *)local_60);
  }
  return;
}

Assistant:

void QPathEdit::dialogFileSelected(const QString &file) {
	if(!file.isEmpty()) {
        QStringList files = dialog->selectedFiles();
        edit->setText(files.first()
                           .replace(QStringLiteral("\\"),
                                    QStringLiteral("/")));
		editTextUpdate();
	}
}